

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

_Bool node_verify(wb_tree *tree,wb_node *parent,wb_node *node,uint *weight)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint32_t uVar4;
  uint rweight;
  uint lweight;
  uint32_t local_20;
  uint32_t local_1c;
  
  if (parent == (wb_node *)0x0) {
    if (tree->root != node) {
      node_verify_cold_2();
      return false;
    }
  }
  else if ((parent->llink != node) && (parent->rlink != node)) {
    node_verify_cold_1();
    return false;
  }
  if (node == (wb_node *)0x0) {
    *weight = 1;
    return true;
  }
  if (node->parent != parent) {
    node_verify_cold_3();
    return false;
  }
  if (parent != (wb_node *)0x0) {
    if (parent->llink == node) {
      iVar3 = (*tree->cmp_func)(parent->key,node->key);
      if (iVar3 < 1) {
        node_verify_cold_6();
        return false;
      }
    }
    else {
      if (parent->rlink != node) {
        node_verify_cold_4();
        goto LAB_00106c5d;
      }
      iVar3 = (*tree->cmp_func)(parent->key,node->key);
      if (-1 < iVar3) {
        node_verify_cold_5();
        return false;
      }
    }
  }
  _Var2 = node_verify(tree,node,node->llink,&local_1c);
  if (!_Var2) {
    return false;
  }
  _Var2 = node_verify(tree,node,node->rlink,&local_20);
  if (!_Var2) {
    return false;
  }
  if (node->llink == (wb_node *)0x0) {
    uVar4 = 1;
  }
  else {
    uVar4 = node->llink->weight;
  }
  if (uVar4 == local_1c) {
    if (node->rlink == (wb_node *)0x0) {
      uVar4 = 1;
    }
    else {
      uVar4 = node->rlink->weight;
    }
    if (uVar4 != local_20) {
      node_verify_cold_8();
      return false;
    }
    uVar1 = node->weight;
    if (uVar1 != local_20 + local_1c) {
      node_verify_cold_9();
      return false;
    }
    if (uVar1 * 0x124 <= local_1c * 1000) {
      if (uVar1 * 0x2c4 < local_1c * 1000) {
        node_verify_cold_10();
        return false;
      }
      *weight = local_20 + local_1c;
      return true;
    }
    node_verify_cold_11();
    return false;
  }
LAB_00106c5d:
  node_verify_cold_7();
  return false;
}

Assistant:

static bool
node_verify(const wb_tree* tree, const wb_node* parent, const wb_node* node,
	    unsigned *weight)
{
    if (!parent) {
	VERIFY(tree->root == node);
    } else {
	VERIFY(parent->llink == node || parent->rlink == node);
    }
    if (node) {
	VERIFY(node->parent == parent);
	if (parent) {
	    if (parent->llink == node) {
		VERIFY(tree->cmp_func(parent->key, node->key) > 0);
	    } else {
		ASSERT(parent->rlink == node);
		VERIFY(tree->cmp_func(parent->key, node->key) < 0);
	    }
	}
	unsigned lweight, rweight;
	if (!node_verify(tree, node, node->llink, &lweight) ||
	    !node_verify(tree, node, node->rlink, &rweight))
	    return false;
	VERIFY(WEIGHT(node->llink) == lweight);
	VERIFY(WEIGHT(node->rlink) == rweight);
	VERIFY(node->weight == lweight + rweight);
	VERIFY(lweight * 1000U >= node->weight * 292U);
	VERIFY(lweight * 1000U <= node->weight * 708U);
	*weight = lweight + rweight;
    } else {
	*weight = 1;
    }
    return true;
}